

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMap<ProKey,_ProStringList>::insert
          (QMap<ProKey,_ProStringList> *this,ProKey *key,ProStringList *value)

{
  long lVar1;
  bool bVar2;
  QMap<ProKey,_ProStringList> *in_RDI;
  long in_FS_OFFSET;
  QMap<ProKey,_ProStringList> copy;
  iterator in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  key_type *in_stack_ffffffffffffffd0;
  map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
  *this_00;
  iterator local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
             *)0xaaaaaaaaaaaaaaaa;
  bVar2 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
          ::isShared(&in_RDI->d);
  if (bVar2) {
    QMap(in_RDI,(QMap<ProKey,_ProStringList> *)in_stack_ffffffffffffff98._M_node);
  }
  else {
    memset(&stack0xffffffffffffffd8,0,8);
    QMap((QMap<ProKey,_ProStringList> *)0x175fb2);
  }
  detach(in_RDI);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                *)0x175fc6);
  std::
  map<ProKey,ProStringList,std::less<ProKey>,std::allocator<std::pair<ProKey_const,ProStringList>>>
  ::insert_or_assign<ProStringList_const&>
            (this_00,in_stack_ffffffffffffffd0,
             (ProStringList *)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8));
  iterator::iterator((iterator *)0x176010,in_stack_ffffffffffffff98);
  ~QMap((QMap<ProKey,_ProStringList> *)0x17601a);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)(iterator)local_20._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        // TODO: improve. In case of assignment, why copying first?
        detach();
        return iterator(d->m.insert_or_assign(key, value).first);
    }